

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *
duckdb::BoundExpression::GetExpression(ParsedExpression *expr)

{
  BoundExpression *pBVar1;
  InternalException *this;
  allocator local_39;
  string local_38;
  
  pBVar1 = BaseExpression::Cast<duckdb::BoundExpression>(&expr->super_BaseExpression);
  if ((pBVar1->expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
      _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    return &pBVar1->expr;
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"BoundExpression::GetExpression called on empty bound expression",
             &local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<Expression> &BoundExpression::GetExpression(ParsedExpression &expr) {
	auto &bound_expr = expr.Cast<BoundExpression>();
	if (!bound_expr.expr) {
		throw InternalException("BoundExpression::GetExpression called on empty bound expression");
	}
	return bound_expr.expr;
}